

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O1

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++:3826:46)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_layout_c__:3826:46)>
      *this)

{
  OrphanBuilder *ref;
  
  ref = (this->func).this;
  if (((ref->tag).content & 2) == 0) {
    capnp::_::WireHelpers::zeroObject(ref->segment,ref->capTable,(WirePointer *)ref,ref->location);
  }
  else {
    capnp::_::WireHelpers::zeroObject(ref->segment,ref->capTable,(WirePointer *)ref);
  }
  ref->location = (word *)0x0;
  (ref->tag).content = 0;
  ref->segment = (SegmentBuilder *)0x0;
  return;
}

Assistant:

void run() override {
    func();
  }